

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

string * toCamelCase(string *__return_storage_ptr__,string *value,bool keepSeparatedNumbersSeparated
                    )

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  size_type sVar4;
  bool bVar5;
  char local_61;
  ulong local_38;
  size_t i;
  bool keepSeparatedNumbersSeparated_local;
  string *value_local;
  string *result;
  
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (value);
  bVar5 = true;
  if (!bVar1) {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](value,0);
    iVar2 = isupper((int)*pvVar3);
    bVar5 = true;
    if (iVar2 == 0) {
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](value,0);
      iVar2 = isdigit((int)*pvVar3);
      bVar5 = iVar2 != 0;
    }
  }
  if (!bVar5) {
    __assert_fail("value.empty() || isupper( value[0] ) || isdigit( value[0] )",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/XMLHelper.hpp"
                  ,0x1bb,"std::string toCamelCase(const std::string &, bool)");
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (value);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,sVar4);
  local_38 = 0;
  do {
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (value);
    if (sVar4 <= local_38) {
      return __return_storage_ptr__;
    }
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](value,local_38);
    if (*pvVar3 == '_') {
      if ((keepSeparatedNumbersSeparated) && (local_38 != 0)) {
        pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](value,local_38 - 1);
        iVar2 = isdigit((int)*pvVar3);
        if ((iVar2 != 0) &&
           (sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size(value), local_38 < sVar4 - 1)) {
          pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[](value,local_38 + 1);
          iVar2 = isdigit((int)*pvVar3);
          if (iVar2 != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,'_');
          }
        }
      }
    }
    else {
      if ((local_38 == 0) ||
         (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[](value,local_38 - 1), *pvVar3 == '_')) {
LAB_0011f4c6:
        pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](value,local_38);
        local_61 = *pvVar3;
      }
      else {
        pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](value,local_38 - 1);
        iVar2 = isdigit((int)*pvVar3);
        if (iVar2 != 0) goto LAB_0011f4c6;
        pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](value,local_38);
        iVar2 = tolower((int)*pvVar3);
        local_61 = (char)iVar2;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,local_61);
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

inline std::string toCamelCase( std::string const & value, bool keepSeparatedNumbersSeparated )
{
  assert( value.empty() || isupper( value[0] ) || isdigit( value[0] ) );
  std::string result;
  result.reserve( value.size() );
  for ( size_t i = 0; i < value.size(); ++i )
  {
    if ( value[i] == '_' )
    {
      if ( keepSeparatedNumbersSeparated && ( 0 < i ) && isdigit( value[i - 1] ) && ( i < value.size() - 1 ) && isdigit( value[i + 1] ) )
      {
        result.push_back( '_' );
      }
    }
    else
    {
      result.push_back( ( ( 0 == i ) || ( value[i - 1] == '_' ) || isdigit( value[i - 1] ) ) ? value[i] : static_cast<char>( tolower( value[i] ) ) );
    }
  }
  return result;
}